

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_ast.c
# Opt level: O2

gnode_t * gnode_block_stat_create
                    (gnode_n type,gtoken_s token,gnode_r *stmts,gnode_t *decl,uint32_t block_length)

{
  gnode_t *pgVar1;
  
  pgVar1 = (gnode_t *)gravity_calloc((gravity_vm *)0x0,1,0x60);
  pgVar1->tag = type;
  (pgVar1->token).type = token.type;
  (pgVar1->token).lineno = token.lineno;
  (pgVar1->token).colno = token.colno;
  (pgVar1->token).position = token.position;
  (pgVar1->token).bytes = token.bytes;
  (pgVar1->token).length = token.length;
  (pgVar1->token).fileid = token.fileid;
  (pgVar1->token).builtin = token.builtin;
  (pgVar1->token).value = token.value;
  pgVar1->decl = decl;
  pgVar1->block_length = block_length;
  *(gnode_r **)&pgVar1[1].block_length = stmts;
  pgVar1[1].token.type = ~TOK_EOF;
  return pgVar1;
}

Assistant:

gnode_t *gnode_block_stat_create (gnode_n type, gtoken_s token, gnode_r *stmts, gnode_t *decl, uint32_t block_length) {
    gnode_compound_stmt_t *node = (gnode_compound_stmt_t *)mem_alloc(NULL, sizeof(gnode_compound_stmt_t));

    SETBASE(node, type, token);
    SETDECL(node, decl);
	node->base.block_length = block_length;
    node->stmts = stmts;
    node->nclose = UINT32_MAX;
    return (gnode_t *)node;
}